

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O3

int LZWPreEncode(TIFF *tif,uint16_t s)

{
  uint8_t *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    puVar2 = *(undefined8 **)(puVar1 + 0x120);
    if (puVar2 == (undefined8 *)0x0) {
      (*tif->tif_setupencode)(tif);
      puVar2 = *(undefined8 **)(puVar1 + 0x120);
    }
    puVar1[0x80] = '\t';
    puVar1[0x81] = '\0';
    puVar1[0x82] = 0xff;
    puVar1[0x83] = '\x01';
    puVar1[0x84] = '\x02';
    puVar1[0x85] = '\x01';
    puVar1[0x88] = '\0';
    puVar1[0x89] = '\0';
    puVar1[0x8a] = '\0';
    puVar1[0x8b] = '\0';
    puVar1[0x8c] = '\0';
    puVar1[0x8d] = '\0';
    puVar1[0x8e] = '\0';
    puVar1[0x8f] = '\0';
    puVar1[0x90] = '\0';
    puVar1[0x91] = '\0';
    puVar1[0x92] = '\0';
    puVar1[0x93] = '\0';
    puVar1[0x94] = '\0';
    puVar1[0x95] = '\0';
    puVar1[0x96] = '\0';
    puVar1[0x97] = '\0';
    puVar1[0xf8] = '\x10';
    puVar1[0xf9] = '\'';
    puVar1[0xfa] = '\0';
    puVar1[0xfb] = '\0';
    puVar1[0xfc] = '\0';
    puVar1[0xfd] = '\0';
    puVar1[0xfe] = '\0';
    puVar1[0xff] = '\0';
    puVar1[0x100] = '\0';
    puVar1[0x101] = '\0';
    puVar1[0x102] = '\0';
    puVar1[0x103] = '\0';
    puVar1[0x104] = '\0';
    puVar1[0x105] = '\0';
    puVar1[0x106] = '\0';
    puVar1[0x107] = '\0';
    puVar1[0x108] = '\0';
    puVar1[0x109] = '\0';
    puVar1[0x10a] = '\0';
    puVar1[0x10b] = '\0';
    puVar1[0x10c] = '\0';
    puVar1[0x10d] = '\0';
    puVar1[0x10e] = '\0';
    puVar1[0x10f] = '\0';
    puVar1[0x110] = '\0';
    puVar1[0x111] = '\0';
    puVar1[0x112] = '\0';
    puVar1[0x113] = '\0';
    puVar1[0x114] = '\0';
    puVar1[0x115] = '\0';
    puVar1[0x116] = '\0';
    puVar1[0x117] = '\0';
    *(uint8_t **)(puVar1 + 0x118) = tif->tif_rawdata + tif->tif_rawdatasize + -5;
    puVar3 = puVar2 + 18000;
    uVar4 = 0x2329;
    do {
      puVar3[-0xe] = 0xffffffffffffffff;
      puVar3[-0xc] = 0xffffffffffffffff;
      puVar3[-10] = 0xffffffffffffffff;
      puVar3[-8] = 0xffffffffffffffff;
      puVar3[-6] = 0xffffffffffffffff;
      puVar3[-4] = 0xffffffffffffffff;
      puVar3[-2] = 0xffffffffffffffff;
      *puVar3 = 0xffffffffffffffff;
      puVar3 = puVar3 + -0x10;
      uVar4 = uVar4 - 8;
    } while (7 < uVar4);
    *puVar2 = 0xffffffffffffffff;
    puVar1[0xf4] = 0xff;
    puVar1[0xf5] = 0xff;
    puVar1[0xf6] = '\0';
    puVar1[0xf7] = '\0';
    return 1;
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                ,0x419,"int LZWPreEncode(TIFF *, uint16_t)");
}

Assistant:

static int LZWPreEncode(TIFF *tif, uint16_t s)
{
    LZWCodecState *sp = EncoderState(tif);

    (void)s;
    assert(sp != NULL);

    if (sp->enc_hashtab == NULL)
    {
        tif->tif_setupencode(tif);
    }

    sp->lzw_nbits = BITS_MIN;
    sp->lzw_maxcode = MAXCODE(BITS_MIN);
    sp->lzw_free_ent = CODE_FIRST;
    sp->lzw_nextbits = 0;
    sp->lzw_nextdata = 0;
    sp->enc_checkpoint = CHECK_GAP;
    sp->enc_ratio = 0;
    sp->enc_incount = 0;
    sp->enc_outcount = 0;
    /*
     * The 4 here insures there is space for 2 max-sized
     * codes in LZWEncode and LZWPostDecode.
     */
    sp->enc_rawlimit = tif->tif_rawdata + tif->tif_rawdatasize - 1 - 4;
    cl_hash(sp);                   /* clear hash table */
    sp->enc_oldcode = (hcode_t)-1; /* generates CODE_CLEAR in LZWEncode */
    return (1);
}